

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

FunctionBody *
Js::FunctionBody::NewFromParseableFunctionInfo(ParseableFunctionInfo *parseableFunctionInfo)

{
  NestedArray *pNVar1;
  Recycler *alloc;
  FunctionBody *this;
  FunctionInfoPtrPtr pTVar2;
  undefined8 uVar3;
  Type TVar4;
  uint index;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pNVar1 = (parseableFunctionInfo->nestedArray).ptr;
  if (pNVar1 == (NestedArray *)0x0) {
    TVar4 = 0;
  }
  else {
    TVar4 = pNVar1->nestedCount;
  }
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ab02c8;
  data.filename._0_4_ = 0x1fa;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((parseableFunctionInfo->super_FunctionProxy).m_scriptContext)->recycler,
                     (TrackAllocData *)local_50);
  index = 0;
  uVar3 = 0;
  this = (FunctionBody *)new<Memory::Recycler>(0x1e8,alloc,0x775d84);
  FunctionBody(this,parseableFunctionInfo);
  if (TVar4 != 0) {
    do {
      pTVar2 = ParseableFunctionInfo::GetNestedFuncReference(parseableFunctionInfo,index);
      ParseableFunctionInfo::SetNestedFunc
                ((ParseableFunctionInfo *)this,pTVar2->ptr,index,(uint32)uVar3);
      index = index + 1;
    } while (TVar4 != index);
  }
  return this;
}

Assistant:

FunctionBody *
    FunctionBody::NewFromParseableFunctionInfo(ParseableFunctionInfo * parseableFunctionInfo)
    {
        ScriptContext * scriptContext = parseableFunctionInfo->GetScriptContext();
        uint nestedCount = parseableFunctionInfo->GetNestedCount();

        FunctionBody * functionBody = RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(),
            FunctionBody,
            parseableFunctionInfo);

        // Initialize nested function array, update back pointers
        for (uint i = 0; i < nestedCount; i++)
        {
            FunctionInfo * nestedInfo = parseableFunctionInfo->GetNestedFunc(i);
            functionBody->SetNestedFunc(nestedInfo, i, 0);
        }

        return functionBody;
    }